

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sDrawTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Stress::anon_unknown_0::IndexGroup::init(IndexGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *node;
  DrawTest *pDVar1;
  IndexType type;
  IndexType type_00;
  Storage storage;
  long lVar2;
  int *piVar3;
  allocator<char> local_1bd;
  DrawMethod local_1bc;
  IndexTest *local_1b8;
  long local_1b0;
  MovePtr<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_> test;
  string iterationDesc;
  string desc;
  string name;
  DrawTestSpec local_118;
  IndexTest tests [2];
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  tests[1].aligned = false;
  tests[1]._9_3_ = 0;
  tests[1].offsets[0] = 2;
  tests[1].offsets[1] = 3;
  tests[1].offsets[2] = -1;
  tests[0].offsets[1] = 3;
  tests[0].offsets[2] = -1;
  tests[1].storage = STORAGE_BUFFER;
  tests[1].type = INDEXTYPE_INT;
  tests[0]._0_8_ = &DAT_100000001;
  tests[0].aligned = false;
  tests[0]._9_3_ = 0;
  tests[0].offsets[0] = 1;
  deqp::gls::DrawTestSpec::DrawTestSpec(&local_118);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "unaligned_buffer","unaligned buffer");
  local_1bc = this->m_method;
  local_118.apiType.m_bits = 3;
  local_118.primitive = PRIMITIVE_TRIANGLES;
  local_118.primitiveCount = 5;
  local_118.indexType = INDEXTYPE_LAST;
  local_118.indexPointerOffset = 0;
  local_118.indexStorage = STORAGE_LAST;
  local_118.first = 0;
  local_118.indexMin = 0;
  local_118.indexMax = 0;
  local_118.instanceCount = 1;
  local_118.drawMethod = local_1bc;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize(&local_118.attribs,2);
  (local_118.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->inputType = INPUTTYPE_FLOAT;
  (local_118.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->outputType = OUTPUTTYPE_VEC2;
  *(undefined1 **)
   &(local_118.attribs.
     super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
     ._M_impl.super__Vector_impl_data._M_start)->storage = &DAT_100000001;
  (local_118.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->componentCount = 4;
  (local_118.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->instanceDivisor = 0;
  (local_118.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->useDefaultAttribute = false;
  (local_118.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (local_118.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  (local_118.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalize = false;
  local_118.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].inputType = INPUTTYPE_FLOAT;
  local_118.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].outputType = OUTPUTTYPE_VEC2;
  *(undefined1 **)
   &local_118.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].storage = &DAT_100000001;
  local_118.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].componentCount = 2;
  local_118.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].instanceDivisor = 0;
  local_118.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].useDefaultAttribute = false;
  local_118.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].normalize = false;
  local_118.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].offset = 0;
  local_118.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].stride = 0;
  tcu::TestNode::addChild((TestNode *)this,node);
  piVar3 = tests[0].offsets;
  for (local_1b0 = 0; local_1b0 != 2; local_1b0 = local_1b0 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&desc,"index_",(allocator<char> *)&local_70);
    local_1b8 = tests + local_1b0;
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              (&iterationDesc,(DrawTestSpec *)(ulong)tests[local_1b0].type,type);
    std::operator+(&name,&desc,&iterationDesc);
    std::__cxx11::string::~string((string *)&iterationDesc);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"index ",&local_1bd);
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              ((string *)&test,(DrawTestSpec *)(ulong)local_1b8->type,type_00);
    std::operator+(&local_70,&local_90,(string *)&test);
    std::operator+(&iterationDesc,&local_70," in ");
    deqp::gls::DrawTestSpec::storageToString_abi_cxx11_
              (&local_50,(DrawTestSpec *)(ulong)local_1b8->storage,storage);
    std::operator+(&desc,&iterationDesc,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&iterationDesc);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&test);
    std::__cxx11::string::~string((string *)&local_90);
    pDVar1 = (DrawTest *)operator_new(0x138);
    deqp::gls::DrawTest::DrawTest
              (pDVar1,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               ((this->super_TestCaseGroup).m_context)->m_renderCtx,name._M_dataplus._M_p,
               desc._M_dataplus._M_p);
    local_118.indexType = local_1b8->type;
    local_118.indexStorage = local_1b8->storage;
    if ((local_1bc == DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX) ||
       (local_1bc == DRAWMETHOD_DRAWELEMENTS_RANGED)) {
      local_118.indexMin = 0;
      local_118.indexMax = 0x37;
    }
    test.super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>.m_data.ptr
         = pDVar1;
    for (lVar2 = 0;
        (pDVar1 = test.
                  super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>.
                  m_data.ptr, lVar2 != 0xc && (*(int *)((long)piVar3 + lVar2) != -1));
        lVar2 = lVar2 + 4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"offset ",(allocator<char> *)&local_50);
      de::toString<int>(&local_90,(int *)(lVar2 + (long)piVar3));
      std::operator+(&iterationDesc,&local_70,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      local_118.indexPointerOffset = *(int *)(lVar2 + (long)piVar3);
      deqp::gls::DrawTest::addIteration
                (test.
                 super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>.
                 m_data.ptr,&local_118,iterationDesc._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&iterationDesc);
    }
    test.super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>.m_data.ptr
         = (DrawTest *)0x0;
    tcu::TestNode::addChild(node,(TestNode *)pDVar1);
    de::details::UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>::
    ~UniqueBase(&test.
                 super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&name);
    piVar3 = piVar3 + 6;
  }
  std::
  _Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::~_Vector_base(&local_118.attribs.
                   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 );
  return extraout_EAX;
}

Assistant:

void IndexGroup::init (void)
{
	struct IndexTest
	{
		gls::DrawTestSpec::Storage		storage;
		gls::DrawTestSpec::IndexType	type;
		bool							aligned;
		int								offsets[3];
	};

	const IndexTest tests[] =
	{
		{ gls::DrawTestSpec::STORAGE_BUFFER,	gls::DrawTestSpec::INDEXTYPE_SHORT,	false,	{ 1, 3, -1 } },
		{ gls::DrawTestSpec::STORAGE_BUFFER,	gls::DrawTestSpec::INDEXTYPE_INT,	false,	{ 2, 3, -1 } },
	};

	gls::DrawTestSpec spec;

	tcu::TestCaseGroup* const	unalignedBufferGroup	= new tcu::TestCaseGroup(m_testCtx, "unaligned_buffer", "unaligned buffer");
	const bool					isRangedMethod			= (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED || m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX);

	genBasicSpec(spec, m_method);

	this->addChild(unalignedBufferGroup);

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
	{
		const IndexTest&				indexTest	= tests[testNdx];

		DE_ASSERT(indexTest.storage != gls::DrawTestSpec::STORAGE_USER);
		DE_ASSERT(!indexTest.aligned);
		tcu::TestCaseGroup*				group		= unalignedBufferGroup;

		const std::string				name		= std::string("index_") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		const std::string				desc		= std::string("index ") + gls::DrawTestSpec::indexTypeToString(indexTest.type) + " in " + gls::DrawTestSpec::storageToString(indexTest.storage);
		de::MovePtr<gls::DrawTest>		test		(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), name.c_str(), desc.c_str()));

		spec.indexType			= indexTest.type;
		spec.indexStorage		= indexTest.storage;

		if (isRangedMethod)
		{
			spec.indexMin = 0;
			spec.indexMax = 55;
		}

		for (int iterationNdx = 0; iterationNdx < DE_LENGTH_OF_ARRAY(indexTest.offsets) && indexTest.offsets[iterationNdx] != -1; ++iterationNdx)
		{
			const std::string iterationDesc = std::string("offset ") + de::toString(indexTest.offsets[iterationNdx]);
			spec.indexPointerOffset	= indexTest.offsets[iterationNdx];
			test->addIteration(spec, iterationDesc.c_str());
		}

		DE_ASSERT(spec.isCompatibilityTest() == gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET ||
				  spec.isCompatibilityTest() == gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE);
		group->addChild(test.release());
	}
}